

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5VocabInitVtab(sqlite3 *db,void *pAux,int argc,char **argv,sqlite3_vtab **ppVTab,char **pzErr
                     )

{
  int *__s;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  sqlite3_vtab *psVar6;
  uint uVar7;
  void *__dest;
  bool bVar8;
  int local_64;
  sqlite3_vtab **local_60;
  sqlite3 *local_58;
  char *local_50;
  char *local_48;
  sqlite3_module *local_40;
  int local_34;
  
  local_40 = (sqlite3_module *)pAux;
  if (argc == 6) {
    __s = (int *)argv[1];
    sVar2 = strlen((char *)__s);
    if (sVar2 != 4) goto LAB_0019c91b;
    bVar8 = *__s == 0x706d6574;
  }
  else {
LAB_0019c91b:
    bVar8 = false;
  }
  if (argc != 5 && bVar8 == false) {
    psVar6 = (sqlite3_vtab *)0x0;
    pcVar4 = sqlite3_mprintf("wrong number of vtable arguments");
    *pzErr = pcVar4;
    local_64 = 1;
    goto LAB_0019caeb;
  }
  pcVar4 = argv[(ulong)bVar8 + 3];
  pcVar5 = argv[(ulong)bVar8 + 4];
  local_48 = argv[(ulong)bVar8 * 2 + 1];
  local_58 = db;
  sVar2 = strlen(local_48);
  local_50 = pcVar4;
  sVar3 = strlen(pcVar4);
  local_34 = 0;
  pcVar4 = sqlite3Fts5Strndup(&local_34,pcVar5,-1);
  if (local_34 == 0) {
    sqlite3Fts5Dequote(pcVar4);
    iVar1 = sqlite3_stricmp(pcVar4,"col");
    local_60 = ppVTab;
    if (iVar1 == 0) {
      uVar7 = 0;
LAB_0019ca29:
      local_64 = 0;
      bVar8 = true;
    }
    else {
      iVar1 = sqlite3_stricmp(pcVar4,"row");
      if (iVar1 == 0) {
        uVar7 = 1;
        goto LAB_0019ca29;
      }
      iVar1 = sqlite3_stricmp(pcVar4,"instance");
      if (iVar1 == 0) {
        uVar7 = 2;
        goto LAB_0019ca29;
      }
      uVar7 = 0;
      pcVar5 = sqlite3_mprintf("fts5vocab: unknown table type: %Q",pcVar4);
      *pzErr = pcVar5;
      local_64 = 1;
      bVar8 = false;
    }
    sqlite3_free(pcVar4);
    ppVTab = local_60;
    if (bVar8) {
      local_64 = sqlite3_declare_vtab
                           (local_58,(char *)((long)&DAT_001c3270 +
                                             (long)(int)(&DAT_001c3270)[uVar7]));
      ppVTab = local_60;
    }
  }
  else {
    local_64 = local_34;
    uVar7 = 0;
  }
  psVar6 = (sqlite3_vtab *)sqlite3Fts5MallocZero(&local_64,(long)((int)sVar3 + (int)sVar2 + 0x42));
  if (psVar6 == (sqlite3_vtab *)0x0) {
    psVar6 = (sqlite3_vtab *)0x0;
  }
  else {
    sVar3 = (size_t)((int)sVar3 + 1);
    psVar6[2].pModule = local_40;
    psVar6[2].nRef = uVar7;
    psVar6[1].zErrMsg = (char *)local_58;
    psVar6[1].pModule = (sqlite3_module *)&psVar6[2].zErrMsg;
    __dest = (void *)((long)&psVar6[2].zErrMsg + sVar3);
    *(void **)&psVar6[1].nRef = __dest;
    memcpy(&psVar6[2].zErrMsg,local_50,sVar3);
    memcpy(__dest,local_48,(long)((int)sVar2 + 1));
    sqlite3Fts5Dequote((char *)psVar6[1].pModule);
    sqlite3Fts5Dequote(*(char **)&psVar6[1].nRef);
  }
LAB_0019caeb:
  *ppVTab = psVar6;
  return local_64;
}

Assistant:

static int fts5VocabInitVtab(
  sqlite3 *db,                    /* The SQLite database connection */
  void *pAux,                     /* Pointer to Fts5Global object */
  int argc,                       /* Number of elements in argv array */
  const char * const *argv,       /* xCreate/xConnect argument array */
  sqlite3_vtab **ppVTab,          /* Write the resulting vtab structure here */
  char **pzErr                    /* Write any error message here */
){
  const char *azSchema[] = { 
    "CREATE TABlE vocab(" FTS5_VOCAB_COL_SCHEMA  ")", 
    "CREATE TABlE vocab(" FTS5_VOCAB_ROW_SCHEMA  ")",
    "CREATE TABlE vocab(" FTS5_VOCAB_INST_SCHEMA ")"
  };

  Fts5VocabTable *pRet = 0;
  int rc = SQLITE_OK;             /* Return code */
  int bDb;

  bDb = (argc==6 && strlen(argv[1])==4 && memcmp("temp", argv[1], 4)==0);

  if( argc!=5 && bDb==0 ){
    *pzErr = sqlite3_mprintf("wrong number of vtable arguments");
    rc = SQLITE_ERROR;
  }else{
    int nByte;                      /* Bytes of space to allocate */
    const char *zDb = bDb ? argv[3] : argv[1];
    const char *zTab = bDb ? argv[4] : argv[3];
    const char *zType = bDb ? argv[5] : argv[4];
    int nDb = (int)strlen(zDb)+1; 
    int nTab = (int)strlen(zTab)+1;
    int eType = 0;
    
    rc = fts5VocabTableType(zType, pzErr, &eType);
    if( rc==SQLITE_OK ){
      assert( eType>=0 && eType<ArraySize(azSchema) );
      rc = sqlite3_declare_vtab(db, azSchema[eType]);
    }

    nByte = sizeof(Fts5VocabTable) + nDb + nTab;
    pRet = sqlite3Fts5MallocZero(&rc, nByte);
    if( pRet ){
      pRet->pGlobal = (Fts5Global*)pAux;
      pRet->eType = eType;
      pRet->db = db;
      pRet->zFts5Tbl = (char*)&pRet[1];
      pRet->zFts5Db = &pRet->zFts5Tbl[nTab];
      memcpy(pRet->zFts5Tbl, zTab, nTab);
      memcpy(pRet->zFts5Db, zDb, nDb);
      sqlite3Fts5Dequote(pRet->zFts5Tbl);
      sqlite3Fts5Dequote(pRet->zFts5Db);
    }
  }

  *ppVTab = (sqlite3_vtab*)pRet;
  return rc;
}